

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O0

Vector<float,_2> __thiscall tcu::Vector<float,_4>::toWidth<2>(Vector<float,_4> *this)

{
  Vector<float,_2> VVar1;
  int iVar2;
  long in_RSI;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  int local_1c;
  int i;
  Vector<float,_4> *this_local;
  Vector<float,_2> *res;
  
  Vector<float,_2>::Vector((Vector<float,_2> *)this);
  for (local_1c = 0; iVar2 = ::deMin32(4,2), fVar3 = extraout_XMM0_Da, fVar4 = extraout_XMM0_Db,
      local_1c < iVar2; local_1c = local_1c + 1) {
    this->m_data[local_1c] = *(float *)(in_RSI + (long)local_1c * 4);
  }
  for (; local_1c < 2; local_1c = local_1c + 1) {
    fVar3 = 0.0;
    fVar4 = 0.0;
    this->m_data[local_1c] = 0.0;
  }
  VVar1.m_data[1] = fVar4;
  VVar1.m_data[0] = fVar3;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

inline Vector<T, NewSize> Vector<T, Size>::toWidth (void) const
{
	Vector<T, NewSize> res;
	int i;
	for (i = 0; i < deMin32(Size, NewSize); i++)
		res.m_data[i] = m_data[i];
	for (; i < NewSize; i++)
		res.m_data[i] = T(0);
	return res;
}